

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::Read
          (PosixSequentialFile *this,size_t n,Slice *result,char *scratch)

{
  int *piVar1;
  char *in_R8;
  Slice local_68;
  Status local_58 [3];
  size_t local_40;
  ssize_t read_size;
  char *local_30;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  PosixSequentialFile *this_local;
  Status *status;
  
  read_size._7_1_ = 0;
  local_30 = in_R8;
  scratch_local = scratch;
  result_local = result;
  n_local = n;
  this_local = this;
  Status::Status((Status *)this);
  do {
    local_40 = read(*(int *)(n + 8),local_30,(size_t)result_local);
    if (-1 < (long)local_40) {
      Slice::Slice(&local_68,local_30,local_40);
      *(char **)scratch_local = local_68.data_;
      *(size_t *)(scratch_local + 8) = local_68.size_;
      return (Status)(char *)this;
    }
    piVar1 = __errno_location();
  } while (*piVar1 == 4);
  piVar1 = __errno_location();
  PosixError((anon_unknown_1 *)local_58,(string *)(n + 0x10),*piVar1);
  Status::operator=((Status *)this,local_58);
  Status::~Status(local_58);
  return (Status)(char *)this;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }